

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_2_12_True(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int iVar15;
  int iVar16;
  float *data;
  float *pfVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  int k_count;
  int iVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  uint uVar40;
  float *pfVar41;
  float *pfVar42;
  float *pfVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  int scale;
  long lVar47;
  long lVar48;
  int iVar49;
  int iVar50;
  bool bVar51;
  byte bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  undefined1 auVar97 [12];
  undefined1 auVar96 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar98 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar101;
  undefined1 auVar102 [64];
  int data_width;
  int local_158;
  float local_c8;
  
  auVar61._8_4_ = 0x3effffff;
  auVar61._0_8_ = 0x3effffff3effffff;
  auVar61._12_4_ = 0x3effffff;
  auVar95 = ZEXT1664(auVar61);
  auVar60._8_4_ = 0x80000000;
  auVar60._0_8_ = 0x8000000080000000;
  auVar60._12_4_ = 0x80000000;
  fVar68 = ipoint->scale;
  auVar102 = ZEXT464((uint)fVar68);
  auVar53 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)fVar68),auVar60,0xf8);
  auVar53 = ZEXT416((uint)(fVar68 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  fVar66 = -0.08 / (fVar68 * fVar68);
  scale = (int)auVar53._0_4_;
  auVar54._0_4_ = (int)auVar53._0_4_;
  auVar54._4_4_ = (int)auVar53._4_4_;
  auVar54._8_4_ = (int)auVar53._8_4_;
  auVar54._12_4_ = (int)auVar53._12_4_;
  auVar53 = vcvtdq2ps_avx(auVar54);
  auVar54 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)ipoint->x),auVar60,0xf8);
  auVar54 = ZEXT416((uint)(ipoint->x + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55._0_8_ = (double)auVar54._0_4_;
  auVar55._8_8_ = auVar54._8_8_;
  auVar59._0_8_ = (double)fVar68;
  auVar59._8_8_ = 0;
  auVar54 = vfmadd231sd_fma(auVar55,auVar59,ZEXT816(0x3fe0000000000000));
  auVar58._0_4_ = (float)auVar54._0_8_;
  auVar58._4_12_ = auVar54._4_12_;
  auVar54 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)ipoint->y),auVar60,0xf8);
  fVar3 = auVar58._0_4_ - auVar53._0_4_;
  auVar54 = ZEXT416((uint)(ipoint->y + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = ZEXT416((uint)fVar3);
  auVar56._0_8_ = (double)auVar54._0_4_;
  auVar56._8_8_ = auVar54._8_8_;
  auVar54 = vfmadd231sd_fma(auVar56,auVar59,ZEXT816(0x3fe0000000000000));
  auVar57._0_4_ = (float)auVar54._0_8_;
  auVar57._4_12_ = auVar54._4_12_;
  fVar101 = auVar57._0_4_ - auVar53._0_4_;
  auVar53 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar68),auVar58);
  auVar54 = vpternlogd_avx512vl(auVar61,auVar53,auVar60,0xf8);
  auVar53 = ZEXT416((uint)(auVar53._0_4_ + auVar54._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  if (scale < (int)auVar53._0_4_) {
    auVar62._8_4_ = 0x3effffff;
    auVar62._0_8_ = 0x3effffff3effffff;
    auVar62._12_4_ = 0x3effffff;
    auVar63._8_4_ = 0x80000000;
    auVar63._0_8_ = 0x8000000080000000;
    auVar63._12_4_ = 0x80000000;
    auVar56 = ZEXT416((uint)fVar68);
    auVar53 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar56,auVar57);
    auVar54 = vpternlogd_avx512vl(auVar63,auVar53,auVar62,0xea);
    auVar53 = ZEXT416((uint)(auVar53._0_4_ + auVar54._0_4_));
    auVar53 = vroundss_avx(auVar53,auVar53,0xb);
    if (scale < (int)auVar53._0_4_) {
      auVar53 = vfmadd231ss_fma(auVar58,auVar56,ZEXT416(0x41300000));
      auVar64._8_4_ = 0x80000000;
      auVar64._0_8_ = 0x8000000080000000;
      auVar64._12_4_ = 0x80000000;
      auVar54 = vpternlogd_avx512vl(auVar64,auVar53,auVar62,0xea);
      auVar53 = ZEXT416((uint)(auVar53._0_4_ + auVar54._0_4_));
      auVar53 = vroundss_avx(auVar53,auVar53,0xb);
      if ((int)auVar53._0_4_ + scale <= iimage->width) {
        auVar53 = vfmadd231ss_fma(auVar57,auVar56,ZEXT416(0x41300000));
        auVar11._8_4_ = 0x80000000;
        auVar11._0_8_ = 0x8000000080000000;
        auVar11._12_4_ = 0x80000000;
        auVar54 = vpternlogd_avx512vl(auVar62,auVar53,auVar11,0xf8);
        auVar53 = ZEXT416((uint)(auVar53._0_4_ + auVar54._0_4_));
        auVar53 = vroundss_avx(auVar53,auVar53,0xb);
        if ((int)auVar53._0_4_ + scale <= iimage->height) {
          iVar1 = iimage->data_width;
          pfVar42 = iimage->data;
          iVar49 = scale * 2;
          fVar3 = fVar3 + 0.5;
          pfVar41 = haarResponseY + 0x23;
          pfVar43 = haarResponseX + 0x23;
          uVar22 = 0xfffffff4;
          do {
            auVar53._0_4_ = (float)(int)uVar22;
            auVar53._4_12_ = in_ZMM8._4_12_;
            lVar31 = 0;
            auVar89._0_4_ = (float)(int)(uVar22 | 1);
            auVar89._4_12_ = in_ZMM8._4_12_;
            auVar53 = vfmadd213ss_fma(auVar53,auVar56,ZEXT416((uint)(fVar101 + 0.5)));
            auVar54 = vfmadd213ss_fma(auVar89,auVar56,ZEXT416((uint)(fVar101 + 0.5)));
            iVar16 = (int)auVar53._0_4_;
            iVar25 = (int)auVar54._0_4_;
            iVar18 = (iVar16 + -1) * iVar1;
            iVar15 = (iVar16 + -1 + scale) * iVar1;
            iVar20 = (iVar16 + -1 + iVar49) * iVar1;
            iVar19 = (iVar25 + -1 + iVar49) * iVar1;
            iVar26 = (iVar25 + -1) * iVar1;
            iVar16 = (iVar25 + -1 + scale) * iVar1;
            do {
              iVar25 = (int)lVar31;
              auVar80._0_4_ = (float)(iVar25 + -0xc);
              auVar94._4_12_ = auVar95._4_12_;
              auVar80._4_12_ = auVar94._4_12_;
              auVar53 = vfmadd213ss_fma(auVar80,auVar56,ZEXT416((uint)fVar3));
              iVar27 = (int)auVar53._0_4_;
              auVar81._0_4_ = (float)(iVar25 + -0xb);
              auVar81._4_12_ = auVar94._4_12_;
              auVar53 = vfmadd213ss_fma(auVar81,auVar56,ZEXT416((uint)fVar3));
              iVar39 = iVar27 + -1 + iVar49;
              iVar37 = (int)auVar53._0_4_;
              auVar82._0_4_ = (float)(iVar25 + -10);
              auVar82._4_12_ = auVar94._4_12_;
              auVar54 = ZEXT416((uint)fVar3);
              auVar53 = vfmadd213ss_fma(auVar82,auVar56,auVar54);
              iVar38 = (int)auVar53._0_4_;
              auVar83._0_4_ = (float)(iVar25 + -9);
              auVar83._4_12_ = auVar94._4_12_;
              auVar53 = vfmadd213ss_fma(auVar83,auVar56,auVar54);
              iVar36 = (int)auVar53._0_4_;
              auVar84._0_4_ = (float)(iVar25 + -8);
              auVar84._4_12_ = auVar94._4_12_;
              auVar53 = vfmadd213ss_fma(auVar84,auVar56,auVar54);
              iVar21 = (int)auVar53._0_4_;
              auVar98._0_4_ = (float)(iVar25 + -7);
              auVar98._4_12_ = auVar94._4_12_;
              auVar96._0_4_ = (float)(iVar25 + -6);
              auVar96._4_12_ = auVar94._4_12_;
              auVar94._0_4_ = (float)(iVar25 + -5);
              auVar92._0_4_ = (float)(iVar25 + -4);
              auVar97 = in_ZMM10._4_12_;
              auVar92._4_12_ = auVar97;
              auVar53 = vfmadd213ss_fma(auVar98,auVar56,auVar54);
              auVar91._0_4_ = (float)(iVar25 + -3);
              auVar91._4_12_ = auVar97;
              auVar60 = ZEXT416((uint)fVar3);
              auVar54 = vfmadd213ss_fma(auVar96,auVar56,auVar60);
              auVar90._0_4_ = (float)(iVar25 + -2);
              auVar90._4_12_ = auVar97;
              auVar55 = vfmadd213ss_fma(auVar94,auVar56,auVar60);
              auVar85._0_4_ = (float)(iVar25 + -1);
              auVar85._4_12_ = auVar97;
              auVar57 = vfmadd213ss_fma(auVar92,auVar56,auVar60);
              auVar58 = vfmadd213ss_fma(auVar91,auVar56,auVar60);
              auVar59 = vfmadd213ss_fma(auVar90,auVar56,auVar60);
              auVar60 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar68),auVar60);
              iVar35 = iVar27 + -1 + scale;
              fVar67 = pfVar42[iVar20 + -1 + iVar27];
              fVar71 = pfVar42[iVar18 + iVar39];
              auVar63 = SUB6416(ZEXT464(0x40000000),0);
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar18 + iVar35] -
                                                      pfVar42[iVar20 + iVar35])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar39] -
                                                      pfVar42[iVar18 + -1 + iVar27])));
              auVar62 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar15 + -1 + iVar27] -
                                                      pfVar42[iVar15 + iVar39])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar39] -
                                                      pfVar42[iVar18 + -1 + iVar27])));
              pfVar43[lVar31 + -0x23] = (fVar67 - fVar71) + auVar61._0_4_;
              pfVar41[lVar31 + -0x23] = auVar62._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar19 + -1 + iVar27];
              fVar71 = pfVar42[iVar26 + iVar39];
              iVar50 = (int)auVar53._0_4_;
              iVar33 = iVar37 + -1 + iVar49;
              iVar28 = iVar37 + -1 + scale;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar26 + iVar35] -
                                                      pfVar42[iVar35 + iVar19])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar39 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar27])));
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar16 + -1 + iVar27] -
                                                      pfVar42[iVar16 + iVar39])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar39 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar27])));
              pfVar43[lVar31 + -0xb] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -0xb] = auVar61._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar20 + -1 + iVar37];
              fVar71 = pfVar42[iVar18 + iVar33];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar18 + iVar28] -
                                                      pfVar42[iVar20 + iVar28])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar33] -
                                                      pfVar42[iVar18 + -1 + iVar37])));
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar15 + -1 + iVar37] -
                                                      pfVar42[iVar15 + iVar33])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar33] -
                                                      pfVar42[iVar18 + -1 + iVar37])));
              pfVar43[lVar31 + -0x22] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -0x22] = auVar61._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar19 + -1 + iVar37];
              fVar71 = pfVar42[iVar26 + iVar33];
              iVar27 = iVar38 + -1 + scale;
              iVar35 = iVar38 + -1 + iVar49;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar26 + iVar28] -
                                                      pfVar42[iVar28 + iVar19])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar33 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar37])));
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar16 + -1 + iVar37] -
                                                      pfVar42[iVar16 + iVar33])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar33 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar37])));
              pfVar43[lVar31 + -10] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -10] = auVar61._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar20 + -1 + iVar38];
              fVar71 = pfVar42[iVar18 + iVar35];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar18 + iVar27] -
                                                      pfVar42[iVar20 + iVar27])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar35] -
                                                      pfVar42[iVar18 + -1 + iVar38])));
              auVar61 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar15 + -1 + iVar38] -
                                                      pfVar42[iVar15 + iVar35])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar35] -
                                                      pfVar42[iVar18 + -1 + iVar38])));
              pfVar43[lVar31 + -0x21] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -0x21] = auVar61._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar19 + -1 + iVar38];
              fVar71 = pfVar42[iVar26 + iVar35];
              iVar33 = (int)auVar54._0_4_;
              iVar28 = iVar36 + -1 + scale;
              iVar37 = iVar36 + -1 + iVar49;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar26 + iVar27] -
                                                      pfVar42[iVar27 + iVar19])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar35 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar38])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar16 + -1 + iVar38] -
                                                      pfVar42[iVar16 + iVar35])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar35 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar38])));
              pfVar43[lVar31 + -9] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -9] = auVar54._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar20 + -1 + iVar36];
              fVar71 = pfVar42[iVar18 + iVar37];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar15 + -1 + iVar36] -
                                                      pfVar42[iVar15 + iVar37])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar37] -
                                                      pfVar42[iVar18 + -1 + iVar36])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar18 + iVar28] -
                                                      pfVar42[iVar20 + iVar28])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar37] -
                                                      pfVar42[iVar18 + -1 + iVar36])));
              pfVar43[lVar31 + -0x20] = (fVar67 - fVar71) + auVar54._0_4_;
              pfVar41[lVar31 + -0x20] = auVar53._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar19 + -1 + iVar36];
              fVar71 = pfVar42[iVar26 + iVar37];
              iVar38 = (int)auVar55._0_4_;
              iVar27 = iVar21 + -1 + scale;
              iVar35 = iVar21 + -1 + iVar49;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar26 + iVar28] -
                                                      pfVar42[iVar28 + iVar19])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar37 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar36])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar16 + -1 + iVar36] -
                                                      pfVar42[iVar16 + iVar37])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar37 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar36])));
              pfVar43[lVar31 + -8] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -8] = auVar54._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar20 + -1 + iVar21];
              fVar71 = pfVar42[iVar18 + iVar35];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar15 + -1 + iVar21] -
                                                      pfVar42[iVar15 + iVar35])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar35] -
                                                      pfVar42[iVar18 + -1 + iVar21])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar18 + iVar27] -
                                                      pfVar42[iVar20 + iVar27])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar35] -
                                                      pfVar42[iVar18 + -1 + iVar21])));
              pfVar43[lVar31 + -0x1f] = (fVar67 - fVar71) + auVar54._0_4_;
              pfVar41[lVar31 + -0x1f] = auVar53._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar19 + -1 + iVar21];
              fVar71 = pfVar42[iVar26 + iVar35];
              iVar28 = iVar50 + -1 + scale;
              iVar36 = iVar50 + -1 + iVar49;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar26 + iVar27] -
                                                      pfVar42[iVar27 + iVar19])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar35 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar21])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar16 + -1 + iVar21] -
                                                      pfVar42[iVar16 + iVar35])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar35 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar21])));
              pfVar43[lVar31 + -7] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -7] = auVar54._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar20 + -1 + iVar50];
              fVar71 = pfVar42[iVar18 + iVar36];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar15 + -1 + iVar50] -
                                                      pfVar42[iVar15 + iVar36])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar36] -
                                                      pfVar42[iVar18 + -1 + iVar50])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar18 + iVar28] -
                                                      pfVar42[iVar20 + iVar28])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar36] -
                                                      pfVar42[iVar18 + -1 + iVar50])));
              pfVar43[lVar31 + -0x1e] = (fVar67 - fVar71) + auVar54._0_4_;
              pfVar41[lVar31 + -0x1e] = auVar53._0_4_ - (fVar67 - fVar71);
              in_ZMM10 = ZEXT464((uint)pfVar42[iVar36 + iVar19]);
              fVar67 = pfVar42[iVar19 + -1 + iVar50];
              iVar37 = (int)auVar57._0_4_;
              fVar71 = pfVar42[iVar26 + iVar36];
              auVar54 = ZEXT416((uint)(pfVar42[iVar36 + iVar19] - pfVar42[iVar26 + -1 + iVar50]));
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar26 + iVar28] -
                                                      pfVar42[iVar28 + iVar19])),auVar63,auVar54);
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar16 + -1 + iVar50] -
                                                      pfVar42[iVar16 + iVar36])),auVar63,auVar54);
              pfVar43[lVar31 + -6] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -6] = auVar54._0_4_ - (fVar67 - fVar71);
              iVar36 = iVar33 + -1 + scale;
              iVar27 = iVar33 + -1 + iVar49;
              fVar67 = pfVar42[iVar20 + -1 + iVar33];
              fVar71 = pfVar42[iVar18 + iVar27];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar18 + iVar36] -
                                                      pfVar42[iVar20 + iVar36])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar27] -
                                                      pfVar42[iVar18 + -1 + iVar33])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar15 + -1 + iVar33] -
                                                      pfVar42[iVar15 + iVar27])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar27] -
                                                      pfVar42[iVar18 + -1 + iVar33])));
              pfVar43[lVar31 + -0x1d] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -0x1d] = auVar54._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar19 + -1 + iVar33];
              fVar71 = pfVar42[iVar26 + iVar27];
              iVar28 = (int)auVar58._0_4_;
              iVar21 = iVar38 + -1 + iVar49;
              iVar35 = iVar38 + -1 + scale;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar26 + iVar36] -
                                                      pfVar42[iVar36 + iVar19])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar27 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar33])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar16 + -1 + iVar33] -
                                                      pfVar42[iVar16 + iVar27])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar27 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar33])));
              pfVar43[lVar31 + -5] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -5] = auVar54._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar20 + -1 + iVar38];
              fVar71 = pfVar42[iVar18 + iVar21];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar18 + iVar35] -
                                                      pfVar42[iVar20 + iVar35])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar21] -
                                                      pfVar42[iVar18 + -1 + iVar38])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar15 + -1 + iVar38] -
                                                      pfVar42[iVar15 + iVar21])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar21] -
                                                      pfVar42[iVar18 + -1 + iVar38])));
              pfVar43[lVar31 + -0x1c] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -0x1c] = auVar54._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar19 + -1 + iVar38];
              fVar71 = pfVar42[iVar26 + iVar21];
              iVar39 = iVar37 + -1 + scale;
              iVar27 = iVar37 + -1 + iVar49;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar26 + iVar35] -
                                                      pfVar42[iVar35 + iVar19])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar21 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar38])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar16 + -1 + iVar38] -
                                                      pfVar42[iVar16 + iVar21])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar21 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar38])));
              pfVar43[lVar31 + -4] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -4] = auVar54._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar20 + -1 + iVar37];
              iVar33 = (int)auVar59._0_4_;
              fVar71 = pfVar42[iVar18 + iVar27];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar18 + iVar39] -
                                                      pfVar42[iVar20 + iVar39])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar27] -
                                                      pfVar42[iVar18 + -1 + iVar37])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar15 + -1 + iVar37] -
                                                      pfVar42[iVar15 + iVar27])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar27] -
                                                      pfVar42[iVar18 + -1 + iVar37])));
              pfVar43[lVar31 + -0x1b] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -0x1b] = auVar54._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar19 + -1 + iVar37];
              in_ZMM8 = ZEXT464((uint)pfVar42[iVar27 + iVar19]);
              fVar71 = pfVar42[iVar26 + iVar27];
              iVar36 = iVar28 + -1 + iVar49;
              iVar35 = iVar28 + -1 + scale;
              auVar54 = ZEXT416((uint)(pfVar42[iVar27 + iVar19] - pfVar42[iVar26 + -1 + iVar37]));
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar26 + iVar39] -
                                                      pfVar42[iVar39 + iVar19])),auVar63,auVar54);
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar16 + -1 + iVar37] -
                                                      pfVar42[iVar16 + iVar27])),auVar63,auVar54);
              pfVar43[lVar31 + -3] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -3] = auVar54._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar20 + -1 + iVar28];
              fVar71 = pfVar42[iVar18 + iVar36];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar18 + iVar35] -
                                                      pfVar42[iVar20 + iVar35])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar36] -
                                                      pfVar42[iVar18 + -1 + iVar28])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar15 + -1 + iVar28] -
                                                      pfVar42[iVar15 + iVar36])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar36] -
                                                      pfVar42[iVar18 + -1 + iVar28])));
              pfVar43[lVar31 + -0x1a] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -0x1a] = auVar54._0_4_ - (fVar67 - fVar71);
              iVar38 = iVar33 + -1 + iVar49;
              fVar67 = pfVar42[iVar19 + -1 + iVar28];
              fVar71 = pfVar42[iVar26 + iVar36];
              auVar95 = ZEXT464((uint)pfVar42[iVar36 + iVar19]);
              iVar21 = (int)auVar60._0_4_;
              iVar27 = iVar33 + -1 + scale;
              auVar54 = ZEXT416((uint)(pfVar42[iVar36 + iVar19] - pfVar42[iVar26 + -1 + iVar28]));
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar26 + iVar35] -
                                                      pfVar42[iVar35 + iVar19])),auVar63,auVar54);
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar16 + -1 + iVar28] -
                                                      pfVar42[iVar16 + iVar36])),auVar63,auVar54);
              pfVar43[lVar31 + -2] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -2] = auVar54._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar20 + -1 + iVar33];
              fVar71 = pfVar42[iVar18 + iVar38];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar18 + iVar27] -
                                                      pfVar42[iVar20 + iVar27])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar38] -
                                                      pfVar42[iVar18 + -1 + iVar33])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar15 + -1 + iVar33] -
                                                      pfVar42[iVar15 + iVar38])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar38] -
                                                      pfVar42[iVar18 + -1 + iVar33])));
              pfVar43[lVar31 + -0x19] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -0x19] = auVar54._0_4_ - (fVar67 - fVar71);
              iVar28 = iVar21 + -1 + scale;
              fVar67 = pfVar42[iVar19 + -1 + iVar33];
              fVar71 = pfVar42[iVar26 + iVar38];
              iVar35 = iVar21 + -1 + iVar49;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar26 + iVar27] -
                                                      pfVar42[iVar27 + iVar19])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar38 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar33])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar16 + -1 + iVar33] -
                                                      pfVar42[iVar16 + iVar38])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar38 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar33])));
              pfVar43[lVar31 + -1] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -1] = auVar54._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar20 + -1 + iVar21];
              fVar71 = pfVar42[iVar18 + iVar35];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar18 + iVar28] -
                                                      pfVar42[iVar20 + iVar28])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar35] -
                                                      pfVar42[iVar18 + -1 + iVar21])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar15 + -1 + iVar21] -
                                                      pfVar42[iVar15 + iVar35])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar20 + iVar35] -
                                                      pfVar42[iVar18 + -1 + iVar21])));
              pfVar43[lVar31 + -0x18] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31 + -0x18] = auVar54._0_4_ - (fVar67 - fVar71);
              fVar67 = pfVar42[iVar19 + -1 + iVar21];
              fVar71 = pfVar42[iVar26 + iVar35];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar26 + iVar28] -
                                                      pfVar42[iVar28 + iVar19])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar35 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar21])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar16 + -1 + iVar21] -
                                                      pfVar42[iVar16 + iVar35])),auVar63,
                                        ZEXT416((uint)(pfVar42[iVar35 + iVar19] -
                                                      pfVar42[iVar26 + -1 + iVar21])));
              pfVar43[lVar31] = (fVar67 - fVar71) + auVar53._0_4_;
              pfVar41[lVar31] = auVar54._0_4_ - (fVar67 - fVar71);
              lVar31 = lVar31 + 0xc;
            } while (iVar25 + -0xc < 0);
            pfVar41 = pfVar41 + 0x30;
            pfVar43 = pfVar43 + 0x30;
            bVar51 = (int)uVar22 < 10;
            uVar22 = uVar22 + 2;
          } while (bVar51);
          goto LAB_001c42df;
        }
      }
    }
  }
  iVar1 = scale * 2;
  lVar31 = 0;
  uVar22 = 0xfffffff4;
  do {
    auVar69._0_4_ = (float)(int)uVar22;
    auVar69._4_12_ = in_ZMM8._4_12_;
    auVar53 = vfmadd213ss_fma(auVar69,auVar102._0_16_,ZEXT416((uint)fVar101));
    auVar72._0_4_ = (float)(int)(uVar22 | 1);
    auVar72._4_12_ = in_ZMM8._4_12_;
    fVar67 = auVar53._0_4_;
    auVar53 = vfmadd213ss_fma(auVar72,auVar102._0_16_,ZEXT416((uint)fVar101));
    fVar71 = auVar53._0_4_;
    iVar18 = (int)((double)((ulong)(0.0 <= fVar67) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar67) * -0x4020000000000000) + (double)fVar67);
    iVar25 = iVar1 + iVar18;
    iVar26 = iVar18 + -1;
    iVar27 = iVar18 + -1 + scale;
    iVar19 = iVar1 + -1 + iVar18;
    iVar15 = (int)((double)((ulong)(0.0 <= fVar71) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar71) * -0x4020000000000000) + (double)fVar71);
    iVar20 = iVar1 + iVar15;
    iVar35 = iVar15 + -1;
    iVar28 = iVar15 + -1 + scale;
    iVar16 = iVar1 + -1 + iVar15;
    lVar30 = lVar31;
    iVar49 = -0xc;
    do {
      pfVar43 = haarResponseY;
      pfVar41 = haarResponseX;
      auVar70._0_4_ = (float)iVar49;
      auVar97 = in_ZMM8._4_12_;
      auVar70._4_12_ = auVar97;
      auVar57 = auVar102._0_16_;
      auVar53 = vfmadd213ss_fma(auVar70,auVar57,auVar55);
      auVar87._0_4_ = (float)(iVar49 + 1);
      auVar87._4_12_ = auVar97;
      auVar78._0_4_ = (float)(iVar49 + 2);
      auVar78._4_12_ = auVar97;
      auVar75._0_4_ = (float)(iVar49 + 3);
      auVar75._4_12_ = auVar97;
      auVar54 = vfmadd213ss_fma(auVar87,auVar57,auVar55);
      auVar56 = vfmadd213ss_fma(auVar78,auVar57,auVar55);
      auVar57 = vfmadd213ss_fma(auVar75,auVar57,auVar55);
      fVar67 = auVar53._0_4_;
      fVar86 = auVar54._0_4_;
      fVar77 = auVar56._0_4_;
      fVar71 = auVar57._0_4_;
      pfVar42 = (float *)((long)haarResponseY + lVar30);
      iVar33 = (int)((double)((ulong)(0.0 <= fVar67) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar67) * -0x4020000000000000) + (double)fVar67);
      if (((iVar18 < 1) || (iVar33 < 1)) || (iimage->height < iVar25)) {
LAB_001c2518:
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar18,iVar33,scale,(float *)((long)haarResponseX + lVar30),pfVar42);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar38 = iimage->width;
        iVar36 = iVar1 + iVar33;
        if (iVar38 < iVar36) goto LAB_001c2518;
        iVar21 = iimage->data_width;
        iVar50 = iVar33 + -1 + scale;
        pfVar17 = iimage->data;
        iVar39 = iVar21 * iVar26;
        iVar37 = iVar21 * iVar19;
        fVar67 = pfVar17[iVar37 + -1 + iVar33];
        fVar74 = pfVar17[iVar39 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar17[iVar39 + iVar50] - pfVar17[iVar37 + iVar50]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar17[iVar37 + -1 + iVar36] -
                                                pfVar17[iVar39 + -1 + iVar33])));
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar17[iVar21 * iVar27 + -1 + iVar33] -
                                                pfVar17[iVar21 * iVar27 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar17[iVar37 + -1 + iVar36] -
                                                pfVar17[iVar39 + -1 + iVar33])));
        *(float *)((long)haarResponseX + lVar30) = (fVar67 - fVar74) + auVar53._0_4_;
        *pfVar42 = auVar54._0_4_ - (fVar67 - fVar74);
      }
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x60);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 0x60);
      if (((iVar15 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar20 || (iVar36 = iVar1 + iVar33, iVar38 < iVar36)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar15,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        iVar37 = iVar33 + -1 + scale;
        pfVar2 = iimage->data;
        iVar50 = iVar21 * iVar35;
        iVar39 = iVar21 * iVar16;
        fVar67 = pfVar2[iVar39 + -1 + iVar33];
        fVar74 = pfVar2[iVar50 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar50 + iVar37] - pfVar2[iVar39 + iVar37]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar28 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar28 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar74) + auVar53._0_4_;
        *pfVar17 = auVar54._0_4_ - (fVar67 - fVar74);
      }
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 4);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 4);
      iVar33 = (int)((double)((ulong)(0.0 <= fVar86) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar86) * -0x4020000000000000) + (double)fVar86);
      if (((iVar18 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar25 || (iVar36 = iVar1 + iVar33, iVar38 < iVar36)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar18,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar39 = iVar33 + -1 + scale;
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar37 = iVar21 * iVar26;
        iVar50 = iVar21 * iVar19;
        fVar67 = pfVar2[iVar50 + -1 + iVar33];
        fVar86 = pfVar2[iVar37 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 + iVar39] - pfVar2[iVar50 + iVar39]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar27 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar27 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar86) + auVar53._0_4_;
        *pfVar17 = auVar54._0_4_ - (fVar67 - fVar86);
      }
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 100);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 100);
      if ((((iVar15 < 1) || (iVar33 < 1)) || (iimage->height < iVar20)) ||
         (iVar36 = iVar1 + iVar33, iVar38 < iVar36)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar15,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        iVar37 = iVar33 + -1 + scale;
        pfVar2 = iimage->data;
        iVar50 = iVar21 * iVar35;
        iVar39 = iVar21 * iVar16;
        fVar67 = pfVar2[iVar39 + -1 + iVar33];
        fVar86 = pfVar2[iVar50 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar50 + iVar37] - pfVar2[iVar39 + iVar37]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar28 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar28 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar86) + auVar53._0_4_;
        *pfVar17 = auVar54._0_4_ - (fVar67 - fVar86);
      }
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 8);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 8);
      iVar33 = (int)((double)((ulong)(0.0 <= fVar77) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar77) * -0x4020000000000000) + (double)fVar77);
      if (((iVar18 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar25 || (iVar36 = iVar1 + iVar33, iVar38 < iVar36)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar18,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar39 = iVar33 + -1 + scale;
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar37 = iVar21 * iVar26;
        iVar50 = iVar21 * iVar19;
        fVar67 = pfVar2[iVar50 + -1 + iVar33];
        fVar77 = pfVar2[iVar37 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 + iVar39] - pfVar2[iVar50 + iVar39]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar27 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar27 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar77) + auVar53._0_4_;
        *pfVar17 = auVar54._0_4_ - (fVar67 - fVar77);
      }
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x68);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 0x68);
      if (((iVar15 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar20 || (iVar36 = iVar1 + iVar33, iVar38 < iVar36)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar15,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        iVar37 = iVar33 + -1 + scale;
        pfVar2 = iimage->data;
        iVar50 = iVar21 * iVar35;
        iVar39 = iVar21 * iVar16;
        fVar67 = pfVar2[iVar39 + -1 + iVar33];
        fVar77 = pfVar2[iVar50 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar50 + iVar37] - pfVar2[iVar39 + iVar37]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar28 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar28 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar77) + auVar53._0_4_;
        *pfVar17 = auVar54._0_4_ - (fVar67 - fVar77);
      }
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0xc);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 0xc);
      iVar33 = (int)((double)((ulong)(0.0 <= fVar71) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar71) * -0x4020000000000000) + (double)fVar71);
      if ((((iVar18 < 1) || (iVar33 < 1)) || (iimage->height < iVar25)) ||
         (iVar36 = iVar1 + iVar33, iVar38 < iVar36)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar18,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar39 = iVar33 + -1 + scale;
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar37 = iVar21 * iVar26;
        iVar50 = iVar21 * iVar19;
        fVar67 = pfVar2[iVar50 + -1 + iVar33];
        fVar71 = pfVar2[iVar37 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 + iVar39] - pfVar2[iVar50 + iVar39]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar27 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar27 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar17 = auVar54._0_4_ - (fVar67 - fVar71);
      }
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x6c);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 0x6c);
      if (((iVar15 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar20 || (iVar36 = iVar1 + iVar33, iVar38 < iVar36)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar15,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        iVar37 = iVar33 + -1 + scale;
        pfVar2 = iimage->data;
        iVar50 = iVar21 * iVar35;
        iVar39 = iVar21 * iVar16;
        fVar67 = pfVar2[iVar39 + -1 + iVar33];
        fVar71 = pfVar2[iVar50 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar50 + iVar37] - pfVar2[iVar39 + iVar37]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar28 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar28 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar17 = auVar54._0_4_ - (fVar67 - fVar71);
      }
      auVar65 = vpbroadcastd_avx512vl();
      auVar65 = vpaddd_avx2(auVar65,_DAT_005997c0);
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x10);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 0x10);
      auVar65 = vcvtdq2ps_avx(auVar65);
      auVar13._4_4_ = fVar3;
      auVar13._0_4_ = fVar3;
      auVar13._8_4_ = fVar3;
      auVar13._12_4_ = fVar3;
      auVar13._16_4_ = fVar3;
      auVar13._20_4_ = fVar3;
      auVar13._24_4_ = fVar3;
      auVar13._28_4_ = fVar3;
      auVar14._4_4_ = fVar68;
      auVar14._0_4_ = fVar68;
      auVar14._8_4_ = fVar68;
      auVar14._12_4_ = fVar68;
      auVar14._16_4_ = fVar68;
      auVar14._20_4_ = fVar68;
      auVar14._24_4_ = fVar68;
      auVar14._28_4_ = fVar68;
      auVar54 = vfmadd132ps_fma(auVar65,auVar13,auVar14);
      auVar53 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xff);
      uVar23 = vcmpps_avx512vl(ZEXT1632(auVar54),_DAT_005997e0,0xd);
      bVar51 = (bool)((byte)(uVar23 >> 7) & 1);
      iVar33 = (int)((double)((ulong)bVar51 * 0x3fe0000000000000 +
                             (ulong)!bVar51 * -0x4020000000000000) + (double)auVar53._0_4_);
      if (((iVar18 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar25 || (iVar36 = iVar1 + iVar33, iVar38 < iVar36)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar18,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar39 = iVar33 + -1 + scale;
        iVar37 = iVar21 * iVar26;
        iVar50 = iVar21 * iVar19;
        fVar67 = pfVar2[iVar50 + -1 + iVar33];
        fVar71 = pfVar2[iVar37 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 + iVar39] - pfVar2[iVar50 + iVar39]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar27 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar27 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar17 = auVar56._0_4_ - (fVar67 - fVar71);
      }
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x70);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 0x70);
      if ((((iVar15 < 1) || (iVar33 < 1)) || (iimage->height < iVar20)) ||
         (iVar36 = iVar1 + iVar33, iVar38 < iVar36)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar15,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar37 = iVar33 + -1 + scale;
        iVar50 = iVar21 * iVar35;
        iVar39 = iVar21 * iVar16;
        fVar67 = pfVar2[iVar39 + -1 + iVar33];
        fVar71 = pfVar2[iVar50 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar50 + iVar37] - pfVar2[iVar39 + iVar37]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar28 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar28 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar17 = auVar56._0_4_ - (fVar67 - fVar71);
      }
      auVar53 = vpermilpd_avx((undefined1  [16])0x0,1);
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x14);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 0x14);
      bVar52 = (byte)uVar23;
      iVar33 = (int)((double)((ulong)(bVar52 >> 6 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar52 >> 6 & 1) * -0x4020000000000000) +
                    (double)auVar53._0_4_);
      if (((iVar18 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar25 || (iVar36 = iVar1 + iVar33, iVar38 < iVar36)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar18,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar39 = iVar33 + -1 + scale;
        iVar37 = iVar21 * iVar26;
        iVar50 = iVar21 * iVar19;
        fVar67 = pfVar2[iVar50 + -1 + iVar33];
        fVar71 = pfVar2[iVar37 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 + iVar39] - pfVar2[iVar50 + iVar39]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar27 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar27 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar17 = auVar56._0_4_ - (fVar67 - fVar71);
      }
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x74);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 0x74);
      if (((iVar15 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar20 || (iVar36 = iVar1 + iVar33, iVar38 < iVar36)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar15,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar37 = iVar33 + -1 + scale;
        iVar50 = iVar21 * iVar35;
        iVar39 = iVar21 * iVar16;
        fVar67 = pfVar2[iVar39 + -1 + iVar33];
        fVar71 = pfVar2[iVar50 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar50 + iVar37] - pfVar2[iVar39 + iVar37]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar28 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar28 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar17 = auVar56._0_4_ - (fVar67 - fVar71);
      }
      auVar53 = vmovshdup_avx((undefined1  [16])0x0);
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x18);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 0x18);
      iVar33 = (int)((double)((ulong)(bVar52 >> 5 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar52 >> 5 & 1) * -0x4020000000000000) +
                    (double)auVar53._0_4_);
      if ((((iVar18 < 1) || (iVar33 < 1)) || (iimage->height < iVar25)) ||
         (iVar36 = iVar1 + iVar33, iVar38 < iVar36)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar18,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar39 = iVar33 + -1 + scale;
        iVar37 = iVar21 * iVar26;
        iVar50 = iVar21 * iVar19;
        fVar67 = pfVar2[iVar50 + -1 + iVar33];
        fVar71 = pfVar2[iVar37 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 + iVar39] - pfVar2[iVar50 + iVar39]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar27 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar27 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar17 = auVar56._0_4_ - (fVar67 - fVar71);
      }
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x78);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 0x78);
      if (((iVar15 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar20 || (iVar36 = iVar1 + iVar33, iVar38 < iVar36)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar15,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar37 = iVar33 + -1 + scale;
        iVar50 = iVar21 * iVar35;
        iVar39 = iVar21 * iVar16;
        fVar67 = pfVar2[iVar39 + -1 + iVar33];
        fVar71 = pfVar2[iVar50 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar50 + iVar37] - pfVar2[iVar39 + iVar37]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar28 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar28 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar17 = auVar56._0_4_ - (fVar67 - fVar71);
      }
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x1c);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 0x1c);
      iVar33 = (int)((double)((ulong)(bVar52 >> 4 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar52 >> 4 & 1) * -0x4020000000000000) + 0.0);
      if (((iVar18 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar25 || (iVar36 = iVar1 + iVar33, iVar38 < iVar36)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar18,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar39 = iVar33 + -1 + scale;
        iVar37 = iVar21 * iVar26;
        iVar50 = iVar21 * iVar19;
        fVar67 = pfVar2[iVar50 + -1 + iVar33];
        fVar71 = pfVar2[iVar37 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 + iVar39] - pfVar2[iVar50 + iVar39]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar27 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar27 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar17 = auVar56._0_4_ - (fVar67 - fVar71);
      }
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x7c);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 0x7c);
      if ((((iVar15 < 1) || (iVar33 < 1)) || (iimage->height < iVar20)) ||
         (iVar36 = iVar1 + iVar33, iVar38 < iVar36)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar15,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar37 = iVar33 + -1 + scale;
        iVar50 = iVar21 * iVar35;
        iVar39 = iVar21 * iVar16;
        fVar67 = pfVar2[iVar39 + -1 + iVar33];
        fVar71 = pfVar2[iVar50 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar50 + iVar37] - pfVar2[iVar39 + iVar37]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar28 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar28 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar17 = auVar56._0_4_ - (fVar67 - fVar71);
      }
      auVar53 = vpermilps_avx(auVar54,0xff);
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x20);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 0x20);
      iVar33 = (int)((double)((ulong)(bVar52 >> 3 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar52 >> 3 & 1) * -0x4020000000000000) +
                    (double)auVar53._0_4_);
      if (((iVar18 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar25 || (iVar36 = iVar1 + iVar33, iVar38 < iVar36)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar18,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar39 = iVar33 + -1 + scale;
        iVar37 = iVar21 * iVar26;
        iVar50 = iVar21 * iVar19;
        fVar67 = pfVar2[iVar50 + -1 + iVar33];
        fVar71 = pfVar2[iVar37 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 + iVar39] - pfVar2[iVar50 + iVar39]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar27 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar27 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar17 = auVar56._0_4_ - (fVar67 - fVar71);
      }
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x80);
      pfVar17 = (float *)(lVar30 + 0x80 + (long)pfVar43);
      if (((iVar15 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar20 || (iVar36 = iVar1 + iVar33, iVar38 < iVar36)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar15,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar37 = iVar33 + -1 + scale;
        iVar50 = iVar21 * iVar35;
        iVar39 = iVar21 * iVar16;
        fVar67 = pfVar2[iVar39 + -1 + iVar33];
        fVar71 = pfVar2[iVar50 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar50 + iVar37] - pfVar2[iVar39 + iVar37]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar28 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar28 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar17 = auVar56._0_4_ - (fVar67 - fVar71);
      }
      auVar53 = vpermilpd_avx(auVar54,1);
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x24);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 0x24);
      iVar33 = (int)((double)((ulong)(bVar52 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar52 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar53._0_4_);
      if ((((iVar18 < 1) || (iVar33 < 1)) || (iimage->height < iVar25)) ||
         (iVar36 = iVar1 + iVar33, iVar38 < iVar36)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar18,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar39 = iVar33 + -1 + scale;
        iVar37 = iVar21 * iVar26;
        iVar50 = iVar21 * iVar19;
        fVar67 = pfVar2[iVar50 + -1 + iVar33];
        fVar71 = pfVar2[iVar37 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 + iVar39] - pfVar2[iVar50 + iVar39]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar27 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar27 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar17 = auVar56._0_4_ - (fVar67 - fVar71);
      }
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x84);
      pfVar17 = (float *)(lVar30 + 0x84 + (long)pfVar43);
      if (((iVar15 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar20 || (iVar36 = iVar1 + iVar33, iVar38 < iVar36)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar15,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar37 = iVar33 + -1 + scale;
        iVar50 = iVar21 * iVar35;
        iVar39 = iVar21 * iVar16;
        fVar67 = pfVar2[iVar39 + -1 + iVar33];
        fVar71 = pfVar2[iVar50 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar50 + iVar37] - pfVar2[iVar39 + iVar37]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar28 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar28 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar17 = auVar56._0_4_ - (fVar67 - fVar71);
      }
      auVar53 = vmovshdup_avx(auVar54);
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x28);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 0x28);
      iVar33 = (int)((double)((ulong)(bVar52 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar52 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar53._0_4_);
      if (((iVar18 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar25 || (iVar36 = iVar1 + iVar33, iVar38 < iVar36)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar18,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar39 = iVar33 + -1 + scale;
        iVar37 = iVar21 * iVar26;
        iVar50 = iVar21 * iVar19;
        fVar67 = pfVar2[iVar50 + -1 + iVar33];
        fVar71 = pfVar2[iVar37 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 + iVar39] - pfVar2[iVar50 + iVar39]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar27 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar27 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar17 = auVar56._0_4_ - (fVar67 - fVar71);
      }
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x88);
      pfVar17 = (float *)(lVar30 + 0x88 + (long)pfVar43);
      if ((((iVar15 < 1) || (iVar33 < 1)) || (iimage->height < iVar20)) ||
         (iVar36 = iVar1 + iVar33, iVar38 < iVar36)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar15,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar37 = iVar33 + -1 + scale;
        iVar50 = iVar21 * iVar35;
        iVar39 = iVar21 * iVar16;
        fVar67 = pfVar2[iVar39 + -1 + iVar33];
        fVar71 = pfVar2[iVar50 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar50 + iVar37] - pfVar2[iVar39 + iVar37]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar28 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar28 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar39 + -1 + iVar36] -
                                                pfVar2[iVar50 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar17 = auVar56._0_4_ - (fVar67 - fVar71);
      }
      local_c8 = auVar54._0_4_;
      pfVar42 = (float *)((long)pfVar41 + lVar30 + 0x2c);
      pfVar17 = (float *)((long)pfVar43 + lVar30 + 0x2c);
      iVar33 = (int)((double)((ulong)(bVar52 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar52 & 1) * -0x4020000000000000) + (double)local_c8);
      if (((iVar18 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar25 || (iVar36 = iVar1 + iVar33, iVar38 < iVar36)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar18,iVar33,scale,pfVar42,pfVar17);
        iVar38 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar43 = haarResponseY;
      }
      else {
        iVar21 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar39 = iVar33 + -1 + scale;
        iVar37 = iVar21 * iVar26;
        iVar50 = iVar21 * iVar19;
        fVar67 = pfVar2[iVar50 + -1 + iVar33];
        fVar71 = pfVar2[iVar37 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar37 + iVar39] - pfVar2[iVar50 + iVar39]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar21 * iVar27 + -1 + iVar33] -
                                                pfVar2[iVar21 * iVar27 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar50 + -1 + iVar36] -
                                                pfVar2[iVar37 + -1 + iVar33])));
        *pfVar42 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar17 = auVar54._0_4_ - (fVar67 - fVar71);
      }
      pfVar41 = (float *)((long)pfVar41 + lVar30 + 0x8c);
      pfVar43 = (float *)((long)pfVar43 + lVar30 + 0x8c);
      if (((iVar15 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar20 || (iVar36 = iVar1 + iVar33, iVar38 < iVar36)))) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar15,iVar33,scale,pfVar41,pfVar43);
      }
      else {
        iVar38 = iimage->data_width;
        pfVar42 = iimage->data;
        iVar21 = iVar33 + -1 + scale;
        iVar39 = iVar38 * iVar35;
        iVar37 = iVar38 * iVar16;
        fVar67 = pfVar42[iVar37 + -1 + iVar33];
        fVar71 = pfVar42[iVar39 + -1 + iVar36];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar39 + iVar21] - pfVar42[iVar37 + iVar21]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar42[iVar37 + -1 + iVar36] -
                                                pfVar42[iVar39 + -1 + iVar33])));
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar38 * iVar28 + -1 + iVar33] -
                                                pfVar42[iVar38 * iVar28 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar42[iVar37 + -1 + iVar36] -
                                                pfVar42[iVar39 + -1 + iVar33])));
        *pfVar41 = (fVar67 - fVar71) + auVar53._0_4_;
        *pfVar43 = auVar54._0_4_ - (fVar67 - fVar71);
      }
      auVar102 = ZEXT1664(ZEXT416((uint)fVar68));
      lVar30 = lVar30 + 0x30;
      bVar51 = iVar49 < 0;
      iVar49 = iVar49 + 0xc;
    } while (bVar51);
    lVar31 = lVar31 + 0xc0;
    bVar51 = (int)uVar22 < 10;
    uVar22 = uVar22 + 2;
  } while (bVar51);
LAB_001c42df:
  fVar101 = auVar102._0_4_;
  auVar100._8_4_ = 0x3effffff;
  auVar100._0_8_ = 0x3effffff3effffff;
  auVar100._12_4_ = 0x3effffff;
  auVar99._8_4_ = 0x80000000;
  auVar99._0_8_ = 0x8000000080000000;
  auVar99._12_4_ = 0x80000000;
  auVar53 = vpternlogd_avx512vl(auVar100,ZEXT416((uint)(fVar101 * 0.5)),auVar99,0xf8);
  auVar53 = ZEXT416((uint)(fVar101 * 0.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar100,ZEXT416((uint)(fVar101 * 1.5)),auVar99,0xf8);
  auVar54 = ZEXT416((uint)(fVar101 * 1.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar100,ZEXT416((uint)(fVar101 * 2.5)),auVar99,0xf8);
  auVar55 = ZEXT416((uint)(fVar101 * 2.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar100,ZEXT416((uint)(fVar101 * 3.5)),auVar99,0xf8);
  auVar56 = ZEXT416((uint)(fVar101 * 3.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar100,ZEXT416((uint)(fVar101 * 4.5)),auVar99,0xf8);
  auVar57 = ZEXT416((uint)(fVar101 * 4.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar100,ZEXT416((uint)(fVar101 * 5.5)),auVar99,0xf8);
  auVar58 = ZEXT416((uint)(fVar101 * 5.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar100,ZEXT416((uint)(fVar101 * 6.5)),auVar99,0xf8);
  auVar59 = ZEXT416((uint)(fVar101 * 6.5 + auVar59._0_4_));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar100,ZEXT416((uint)(fVar101 * 7.5)),auVar99,0xf8);
  auVar60 = ZEXT416((uint)(auVar60._0_4_ + fVar101 * 7.5));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar61 = vpternlogd_avx512vl(auVar100,ZEXT416((uint)(fVar101 * 8.5)),auVar99,0xf8);
  auVar61 = ZEXT416((uint)(fVar101 * 8.5 + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar62 = vpternlogd_avx512vl(auVar100,ZEXT416((uint)(fVar101 * 9.5)),auVar99,0xf8);
  auVar62 = ZEXT416((uint)(fVar101 * 9.5 + auVar62._0_4_));
  auVar62 = vroundss_avx(auVar62,auVar62,0xb);
  auVar63 = vpternlogd_avx512vl(auVar100,ZEXT416((uint)(fVar101 * 10.5)),auVar99,0xf8);
  auVar63 = ZEXT416((uint)(fVar101 * 10.5 + auVar63._0_4_));
  auVar63 = vroundss_avx(auVar63,auVar63,0xb);
  auVar64 = vpternlogd_avx512vl(auVar100,ZEXT416((uint)(fVar101 * 11.5)),auVar99,0xf8);
  fVar74 = auVar55._0_4_;
  fVar68 = fVar74 + auVar54._0_4_;
  fVar3 = fVar74 + auVar53._0_4_;
  auVar55 = ZEXT416((uint)(fVar101 * 11.5 + auVar64._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  fVar101 = fVar74 - auVar53._0_4_;
  fVar67 = fVar74 - auVar54._0_4_;
  fVar71 = fVar74 - auVar56._0_4_;
  fVar77 = fVar74 - auVar57._0_4_;
  fVar86 = fVar74 - auVar58._0_4_;
  fVar74 = fVar74 - auVar59._0_4_;
  fVar93 = auVar60._0_4_;
  fVar4 = fVar93 - auVar56._0_4_;
  fVar5 = fVar93 - auVar57._0_4_;
  fVar6 = fVar93 - auVar58._0_4_;
  fVar7 = fVar93 - auVar59._0_4_;
  fVar8 = fVar93 - auVar61._0_4_;
  fVar9 = fVar93 - auVar62._0_4_;
  fVar10 = fVar93 - auVar63._0_4_;
  fVar93 = fVar93 - auVar55._0_4_;
  gauss_s1_c0[0] = expf(fVar68 * fVar68 * fVar66);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar66);
  gauss_s1_c0[2] = expf(fVar101 * fVar101 * fVar66);
  gauss_s1_c0[3] = expf(fVar67 * fVar67 * fVar66);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar71 * fVar71 * fVar66);
  gauss_s1_c0[6] = expf(fVar77 * fVar77 * fVar66);
  gauss_s1_c0[7] = expf(fVar86 * fVar86 * fVar66);
  gauss_s1_c0[8] = expf(fVar74 * fVar74 * fVar66);
  gauss_s1_c1[0] = expf(fVar4 * fVar4 * fVar66);
  gauss_s1_c1[1] = expf(fVar5 * fVar5 * fVar66);
  gauss_s1_c1[2] = expf(fVar6 * fVar6 * fVar66);
  gauss_s1_c1[3] = expf(fVar7 * fVar7 * fVar66);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar8 * fVar8 * fVar66);
  gauss_s1_c1[6] = expf(fVar9 * fVar9 * fVar66);
  gauss_s1_c1[7] = expf(fVar10 * fVar10 * fVar66);
  gauss_s1_c1[8] = expf(fVar93 * fVar93 * fVar66);
  auVar73._8_4_ = 0x7fffffff;
  auVar73._0_8_ = 0x7fffffff7fffffff;
  auVar73._12_4_ = 0x7fffffff;
  uVar23 = 0xfffffff8;
  fVar68 = 0.0;
  lVar31 = 0;
  lVar30 = 0;
  local_158 = 0;
  do {
    pfVar42 = gauss_s1_c1;
    uVar22 = (uint)uVar23;
    if (uVar22 != 7) {
      pfVar42 = gauss_s1_c0;
    }
    lVar47 = (long)local_158;
    lVar30 = (long)(int)lVar30;
    if (uVar22 == 0xfffffff8) {
      pfVar42 = gauss_s1_c1;
    }
    uVar46 = 0;
    local_158 = local_158 + 4;
    uVar40 = 0xfffffff8;
    lVar44 = (long)haarResponseX + lVar31;
    lVar32 = (long)haarResponseY + lVar31;
    do {
      pfVar41 = gauss_s1_c1;
      if (uVar40 != 7) {
        pfVar41 = gauss_s1_c0;
      }
      auVar95 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar40 == 0xfffffff8) {
        pfVar41 = gauss_s1_c1;
      }
      uVar24 = (ulong)(uVar40 >> 0x1c & 0xfffffff8);
      uVar29 = uVar46;
      lVar34 = lVar32;
      lVar48 = lVar44;
      do {
        lVar45 = 0;
        pfVar43 = (float *)((long)pfVar42 + (ulong)(uint)((int)(uVar23 >> 0x1f) << 5));
        do {
          fVar3 = pfVar41[uVar24] * *pfVar43;
          pfVar43 = pfVar43 + (ulong)(~uVar22 >> 0x1f) * 2 + -1;
          auVar53 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + lVar45 * 4)),
                                  ZEXT416(*(uint *)(lVar48 + lVar45 * 4)),0x10);
          lVar45 = lVar45 + 1;
          auVar88._0_4_ = fVar3 * auVar53._0_4_;
          auVar88._4_4_ = fVar3 * auVar53._4_4_;
          auVar88._8_4_ = fVar3 * auVar53._8_4_;
          auVar88._12_4_ = fVar3 * auVar53._12_4_;
          auVar53 = vandps_avx(auVar88,auVar73);
          auVar53 = vmovlhps_avx(auVar88,auVar53);
          auVar76._0_4_ = auVar95._0_4_ + auVar53._0_4_;
          auVar76._4_4_ = auVar95._4_4_ + auVar53._4_4_;
          auVar76._8_4_ = auVar95._8_4_ + auVar53._8_4_;
          auVar76._12_4_ = auVar95._12_4_ + auVar53._12_4_;
          auVar95 = ZEXT1664(auVar76);
        } while (lVar45 != 9);
        uVar29 = uVar29 + 0x18;
        uVar24 = uVar24 + (ulong)(-1 < (int)uVar40) * 2 + -1;
        lVar48 = lVar48 + 0x60;
        lVar34 = lVar34 + 0x60;
      } while (uVar29 < uVar40 * 0x18 + 0x198);
      uVar40 = uVar40 + 5;
      uVar46 = uVar46 + 0x78;
      fVar3 = gauss_s2_arr[lVar47];
      auVar12._4_4_ = fVar3;
      auVar12._0_4_ = fVar3;
      auVar12._8_4_ = fVar3;
      auVar12._12_4_ = fVar3;
      auVar56 = vmulps_avx512vl(auVar76,auVar12);
      lVar47 = lVar47 + 1;
      auVar79._0_4_ = auVar56._0_4_ * auVar56._0_4_;
      auVar79._4_4_ = auVar56._4_4_ * auVar56._4_4_;
      auVar79._8_4_ = auVar56._8_4_ * auVar56._8_4_;
      auVar79._12_4_ = auVar56._12_4_ * auVar56._12_4_;
      auVar54 = vshufpd_avx(auVar56,auVar56,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar30) = auVar56;
      lVar30 = lVar30 + 4;
      lVar44 = lVar44 + 0x1e0;
      lVar32 = lVar32 + 0x1e0;
      auVar53 = vmovshdup_avx(auVar79);
      auVar55 = vfmadd231ss_fma(auVar53,auVar56,auVar56);
      auVar53 = vshufps_avx(auVar56,auVar56,0xff);
      auVar54 = vfmadd213ss_fma(auVar54,auVar54,auVar55);
      auVar53 = vfmadd213ss_fma(auVar53,auVar53,auVar54);
      fVar68 = fVar68 + auVar53._0_4_;
    } while (local_158 != (int)lVar47);
    lVar31 = lVar31 + 0x14;
    uVar23 = (ulong)(uVar22 + 5);
  } while ((int)uVar22 < 3);
  if (fVar68 < 0.0) {
    fVar68 = sqrtf(fVar68);
  }
  else {
    auVar53 = vsqrtss_avx(ZEXT416((uint)fVar68),ZEXT416((uint)fVar68));
    fVar68 = auVar53._0_4_;
  }
  lVar31 = 0;
  auVar95 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar68)));
  do {
    auVar102 = vmulps_avx512f(auVar95,*(undefined1 (*) [64])(ipoint->descriptor + lVar31));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar31) = auVar102;
    lVar31 = lVar31 + 0x10;
  } while (lVar31 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_12_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                float ipoint_x_sub_int_scale_add_k8_mul_scale = ipoint_x_sub_int_scale + k8 * scale;
                float ipoint_x_sub_int_scale_add_k9_mul_scale = ipoint_x_sub_int_scale + k9 * scale;
                float ipoint_x_sub_int_scale_add_k10_mul_scale = ipoint_x_sub_int_scale + k10 * scale;
                float ipoint_x_sub_int_scale_add_k11_mul_scale = ipoint_x_sub_int_scale + k11 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_k6_mul_scale + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_k7_mul_scale + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_k8_mul_scale + (ipoint_x_sub_int_scale_add_k8_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_k9_mul_scale + (ipoint_x_sub_int_scale_add_k9_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_k10_mul_scale + (ipoint_x_sub_int_scale_add_k10_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_k11_mul_scale + (ipoint_x_sub_int_scale_add_k11_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_05 + k8 * scale);
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_05 + k9 * scale);
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_05 + k10 * scale);
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_05 + k11 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count1*24+k_count8], &haarResponseY[l_count1*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count1*24+k_count9], &haarResponseY[l_count1*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count1*24+k_count10], &haarResponseY[l_count1*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count1*24+k_count11], &haarResponseY[l_count1*24+k_count11]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}